

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O0

int lws_plat_ifname_to_hwaddr(int fd,char *ifname,uint8_t *hwaddr,int len)

{
  int iVar1;
  char local_50 [8];
  ifreq i;
  int len_local;
  uint8_t *hwaddr_local;
  char *ifname_local;
  int fd_local;
  
  i.ifr_ifru._20_4_ = len;
  memset(local_50,0,0x28);
  lws_strncpy(local_50,ifname,0x10);
  iVar1 = ioctl(fd,0x8927,local_50);
  if (iVar1 < 0) {
    ifname_local._4_4_ = -1;
  }
  else {
    *(undefined4 *)hwaddr = i.ifr_ifrn._10_4_;
    *(undefined2 *)(hwaddr + 4) = i.ifr_ifrn._14_2_;
    ifname_local._4_4_ = 6;
  }
  return ifname_local._4_4_;
}

Assistant:

int
lws_plat_ifname_to_hwaddr(int fd, const char *ifname, uint8_t *hwaddr, int len)
{
#if defined(__linux__)
	struct ifreq i;

	memset(&i, 0, sizeof(i));
	lws_strncpy(i.ifr_name, ifname, sizeof(i.ifr_name));

	if (ioctl(fd, SIOCGIFHWADDR, &i) < 0)
		return -1;

	memcpy(hwaddr, &i.ifr_hwaddr.sa_data, 6);

	return 6;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}